

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AllOptions::add<Catch::Options::TestCaseOptionParser>(AllOptions *this)

{
  OptionParser *this_00;
  Ptr<Catch::OptionParser> local_20;
  
  this_00 = (OptionParser *)operator_new(0x30);
  Options::TestCaseOptionParser::TestCaseOptionParser((TestCaseOptionParser *)this_00);
  local_20.m_p = this_00;
  (*(((OptionParser *)&this_00->super_SharedImpl<Catch::IShared>)->super_SharedImpl<Catch::IShared>)
    .super_IShared.super_NonCopyable._vptr_NonCopyable[2])(this_00);
  std::vector<Catch::Ptr<Catch::OptionParser>,std::allocator<Catch::Ptr<Catch::OptionParser>>>::
  emplace_back<Catch::Ptr<Catch::OptionParser>>
            ((vector<Catch::Ptr<Catch::OptionParser>,std::allocator<Catch::Ptr<Catch::OptionParser>>>
              *)this,&local_20);
  if (local_20.m_p != (OptionParser *)0x0) {
    (*(((OptionParser *)&(local_20.m_p)->super_SharedImpl<Catch::IShared>)->
      super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

void add() {
            m_parsers.push_back( new T() );
        }